

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\nC++17 introduced Hexadecimal Floating Point Literals ");
  poVar1 = std::operator<<(poVar1,"in three different formats.\n\n");
  poVar1 = std::operator<<(poVar1,"\"0x|0x hex-digit-seq\":\t\t\t\t");
  poVar1 = std::operator<<(poVar1,"0x1ffp96:\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,4.0485591044789077e+31);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"\"0x|0x hex-digit-seq . \":\t\t\t");
  poVar1 = std::operator<<(poVar1,"0xa.p-2:\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2.5);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"\"0x|0X hex-digit-seq . hex-digit-seq\":\t\t");
  poVar1 = std::operator<<(poVar1,"0x1.743p-3:\t\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0.181732177734375);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,'\n');
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
	std::cout << "\nC++17 introduced Hexadecimal Floating Point Literals "
			<<"in three different formats.\n\n" 
			<<"\"0x|0x hex-digit-seq\":\t\t\t\t" << "0x1ffp96:\t\t" << 0x1ffp96 << '\n'
			<<"\"0x|0x hex-digit-seq . \":\t\t\t" << "0xa.p-2:\t\t" << 0xa.p-2 << '\n'
			<<"\"0x|0X hex-digit-seq . hex-digit-seq\":\t\t" << "0x1.743p-3:\t\t" << 0x1.743p-3 << '\n'
		<< '\n' << std::endl;
}